

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O0

scalar_function_t *
duckdb::GetScalarBinaryFunction<duckdb::DecimalSubtractOverflowCheck>(PhysicalType type)

{
  char in_SIL;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *in_RDI;
  scalar_function_t *function;
  PhysicalType in_stack_0000006f;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffffb8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffffc0;
  
  ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::function
            (in_RDI);
  if (in_SIL == '\v') {
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              (in_stack_ffffffffffffffc0,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)in_stack_ffffffffffffffb8
              );
  }
  else if (in_SIL == '\f') {
    ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
              (in_stack_ffffffffffffffc0,
               (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr **)in_stack_ffffffffffffffb8
              );
  }
  else {
    GetScalarIntegerFunction<duckdb::DecimalSubtractOverflowCheck>(in_stack_0000006f);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ::std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0x125b123);
  }
  return in_RDI;
}

Assistant:

static scalar_function_t GetScalarBinaryFunction(PhysicalType type) {
	scalar_function_t function;
	switch (type) {
	case PhysicalType::FLOAT:
		function = &ScalarFunction::BinaryFunction<float, float, float, OP>;
		break;
	case PhysicalType::DOUBLE:
		function = &ScalarFunction::BinaryFunction<double, double, double, OP>;
		break;
	default:
		function = GetScalarIntegerFunction<OP>(type);
		break;
	}
	return function;
}